

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canfdtest.c
# Opt level: O0

void millisleep(int msecs)

{
  int iVar1;
  int in_EDI;
  int err;
  timespec rmtp;
  timespec rqtp;
  timespec local_28;
  timespec local_18;
  
  local_18.tv_sec = (__time_t)(in_EDI / 1000);
  local_18.tv_nsec = (long)((in_EDI % 1000) * 1000000);
  while ((iVar1 = clock_nanosleep(1,0,&local_18,&local_28), iVar1 == 0 || (iVar1 == 4))) {
    local_18.tv_sec = local_28.tv_sec;
    local_18.tv_nsec = local_28.tv_nsec;
    if (iVar1 == 0) {
      return;
    }
  }
  printf("t\n");
  return;
}

Assistant:

static void millisleep(int msecs)
{
	struct timespec rqtp, rmtp;
	int err;

	/* sleep in ms */
	rqtp.tv_sec = msecs / 1000;
	rqtp.tv_nsec = msecs % 1000 * 1000000;

	do {
		err = clock_nanosleep(CLOCK_MONOTONIC, 0, &rqtp, &rmtp);
		if (err != 0 && err != EINTR) {
			printf("t\n");
			break;
		}
		rqtp = rmtp;
	} while (err != 0);
}